

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O1

void __thiscall bloom_tests::bloom_match::test_method(bloom_match *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  uchar *puVar4;
  char *pcVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  value_type *__val;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  Span<const_std::byte> sp_00;
  Span<const_unsigned_char> vKey;
  const_string file;
  Span<const_unsigned_char> vKey_00;
  const_string file_00;
  Span<const_unsigned_char> vKey_01;
  const_string file_01;
  Span<const_unsigned_char> vKey_02;
  const_string file_02;
  Span<const_unsigned_char> vKey_03;
  const_string file_03;
  const_string file_04;
  Span<const_unsigned_char> vKey_04;
  const_string file_05;
  const_string file_06;
  Span<const_unsigned_char> vKey_05;
  const_string file_07;
  Span<const_unsigned_char> vKey_06;
  const_string file_08;
  Span<const_unsigned_char> vKey_07;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  DataStream spendStream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  DataStream stream;
  optional<uint256> u_1;
  CTransaction spendingTx;
  uchar ch [260];
  CTransaction tx;
  optional<uint256> u;
  check_type cVar8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  DataStream local_360;
  byte *local_340;
  long local_338;
  long local_330;
  DataStream local_328;
  undefined1 local_308 [32];
  uchar local_2e8;
  _func_int **local_2d8;
  pointer puStack_2d0;
  pointer local_2c8;
  char *pcStack_2c0;
  undefined1 local_2b8 [24];
  char *pcStack_2a0;
  uint32_t local_298;
  CTransaction local_268;
  byte local_1e8 [259];
  uchar local_e5 [5];
  CTransaction local_e0;
  undefined1 local_60 [32];
  bool local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_1e8,
         _ZTAXtlN4util12hex_literals6detail3HexILm517EEEtlSt5arrayISt4byteLm258EEtlA258_S5_LS5_1ELS5_0ELS5_0ELS5_0ELS5_1ELS5_11ELS5_38ELS5_233ELS5_183ELS5_115ELS5_94ELS5_182ELS5_170ELS5_189ELS5_243ELS5_88ELS5_186ELS5_182ELS5_47ELS5_152ELS5_22ELS5_162ELS5_27ELS5_169ELS5_235ELS5_219ELS5_113ELS5_157ELS5_82ELS5_153ELS5_232ELS5_134ELS5_7ELS5_215ELS5_34ELS5_193ELS5_144ELS5_0ELS5_0ELS5_0ELS5_0ELS5_139ELS5_72ELS5_48ELS5_69ELS5_2ELS5_32ELS5_7ELS5_10ELS5_202ELS5_68ELS5_80ELS5_108ELS5_92ELS5_239ELS5_58ELS5_22ELS5_237ELS5_81ELS5_157ELS5_124ELS5_60ELS5_57ELS5_248ELS5_170ELS5_177ELS5_146ELS5_196ELS5_225ELS5_201ELS5_13ELS5_6ELS5_95ELS5_55ELS5_184ELS5_164ELS5_175ELS5_97ELS5_65ELS5_2ELS5_33ELS5_0ELS5_168ELS5_225ELS5_96ELS5_184ELS5_86ELS5_194ELS5_212ELS5_61ELS5_39ELS5_216ELS5_251ELS5_167ELS5_30ELS5_90ELS5_239ELS5_100ELS5_5ELS5_184ELS5_100ELS5_58ELS5_196ELS5_203ELS5_124ELS5_179ELS5_196ELS5_98ELS5_172ELS5_237ELS5_127ELS5_20ELS5_113ELS5_26ELS5_1ELS5_65ELS5_4ELS5_109ELS5_17ELS5_254ELS5_229ELS5_27ELS5_14ELS5_96ELS5_102ELS5_109ELS5_80ELS5_73ELS5_169ELS5_16ELS5_26ELS5_114ELS5_116ELS5_29ELS5_244ELS5_128ELS5_185ELS5_110ELS5_226ELS5_100ELS5_136ELS5_164ELS5_211ELS5_70ELS5_107ELS5_149ELS5_201ELS5_164ELS5_10ELS5_197ELS5_238ELS5_239ELS5_135ELS5_225ELS5_10ELS5_92ELS5_211ELS5_54ELS5_193ELS5_154ELS5_132ELS5_86ELS5_95ELS5_128ELS5_250ELS5_108ELS5_84ELS5_121ELS5_87ELS5_183ELS5_112ELS5_15ELS5_244ELS5_223ELS5_189ELS5_239ELS5_231ELS5_96ELS5_54ELS5_195ELS5_57ELS5_255ELS5_255ELS5_255ELS5_255ELS5_2ELS5_27ELS5_255ELS5_61ELS5_17ELS5_0ELS5_0ELS5_0ELS5_0ELS5_25ELS5_118ELS5_169ELS5_20ELS5_4ELS5_148ELS5_63ELS5_221ELS5_80ELS5_128ELS5_83ELS5_199ELS5_80ELS5_0ELS5_16ELS5_109ELS5_59ELS5_198ELS5_226ELS5_117ELS5_77ELS5_188ELS5_255ELS5_25ELS5_136ELS5_172ELS5_47ELS5_21ELS5_222ELS5_0ELS5_0ELS5_0ELS5_0ELS5_0ELS5_25ELS5_118ELS5_169ELS5_20ELS5_162ELS5_102ELS5_67ELS5_109ELS5_41ELS5_101ELS5_84ELS5_118ELS5_8ELS5_185ELS5_225ELS5_93ELS5_144ELS5_50ELS5_167ELS5_185ELS5_214ELS5_79ELS5_164ELS5_49ELS5_136ELS5_172EEEEE
         ,0x102);
  sp.m_size = 0x102;
  sp.m_data = local_1e8;
  DataStream::DataStream(&local_328,sp);
  CTransaction::CTransaction<DataStream>(&local_e0,&::TX_WITH_WITNESS,&local_328);
  memcpy(local_1e8,&DAT_00e96070,0x104);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_340,local_1e8,local_e5,
             (allocator_type *)&local_268);
  sp_00.m_size = local_338 - (long)local_340;
  sp_00.m_data = local_340;
  DataStream::DataStream(&local_360,sp_00);
  CTransaction::CTransaction<DataStream>(&local_268,&::TX_WITH_WITNESS,&local_360);
  CBloomFilter::CBloomFilter((CBloomFilter *)local_308,10,1e-06,0,'\x01');
  local_2b8._0_8_ = (_func_int **)0xef65854fcd7fff6b;
  local_2b8._8_8_ = (pointer)0x4ff94f3dd6d56d40;
  local_2b8._16_8_ = (pointer)0xc44dfd2720e88f31;
  pcStack_2a0 = (char *)0xb4749f017444b051;
  vKey.m_size = 0x20;
  vKey.m_data = local_2b8;
  CBloomFilter::insert((CBloomFilter *)local_308,vKey);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x76;
  file.m_begin = (iterator)&local_370;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_380,msg);
  local_60[0] = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_e0);
  local_60._8_8_ = (element_type *)0x0;
  local_60._16_8_ = (sp_counted_base *)0x0;
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_013d4ce0;
  local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_2a0 = "Simple Bloom filter didn\'t match tx hash";
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_388 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,_cVar8,
             (size_t)&local_390,0x76);
  boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
  CBloomFilter::CBloomFilter((CBloomFilter *)local_2b8,10,1e-06,0,'\x01');
  uVar2 = local_308._16_8_;
  uVar1 = local_308._0_8_;
  local_308._0_8_ = local_2b8._0_8_;
  local_308._8_8_ = local_2b8._8_8_;
  local_308._16_8_ = local_2b8._16_8_;
  local_2b8._0_8_ = (_func_int **)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = (pointer)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,uVar2 - uVar1);
  }
  local_2e8 = local_298._0_1_;
  local_308._24_8_ = pcStack_2a0;
  if ((_func_int **)local_2b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
  }
  local_2b8._16_8_ = 0xc44dfd2720e88f31;
  pcStack_2a0 = (char *)0xb4749f017444b051;
  local_2b8._0_8_ = 0xef65854fcd7fff6b;
  local_2b8._8_8_ = 0x4ff94f3dd6d56d40;
  vKey_00.m_size = 0x20;
  vKey_00.m_data = local_2b8;
  CBloomFilter::insert((CBloomFilter *)local_308,vKey_00);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x7b;
  file_00.m_begin = (iterator)&local_3a0;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3b0,
             msg_00);
  local_60[0] = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_e0);
  local_60._8_8_ = (element_type *)0x0;
  local_60._16_8_ = (sp_counted_base *)0x0;
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_013d4d20;
  local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_2a0 = "Simple Bloom filter didn\'t match manually serialized tx hash";
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_3b8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,_cVar8,
             (size_t)&local_3c0,0x7b);
  boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
  CBloomFilter::CBloomFilter((CBloomFilter *)local_2b8,10,1e-06,0,'\x01');
  uVar2 = local_308._16_8_;
  uVar1 = local_308._0_8_;
  local_308._0_8_ = local_2b8._0_8_;
  local_308._8_8_ = local_2b8._8_8_;
  local_308._16_8_ = local_2b8._16_8_;
  local_2b8._0_8_ = (_func_int **)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = (pointer)0x0;
  if ((_func_int **)uVar1 != (_func_int **)0x0) {
    operator_delete((void *)uVar1,uVar2 - uVar1);
  }
  local_2e8 = local_298._0_1_;
  local_308._24_8_ = pcStack_2a0;
  if ((_func_int **)local_2b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
  }
  memcpy(local_2b8,util::hex_literals::detail::Hex<145ul>{std::array<std::byte_72ul>,0x48);
  vKey_01.m_size = 0x48;
  vKey_01.m_data = local_2b8;
  CBloomFilter::insert((CBloomFilter *)local_308,vKey_01);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x7f;
  file_01.m_begin = (iterator)&local_3d0;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3e0,
             msg_01);
  local_60[0] = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_e0);
  local_60._8_8_ = (element_type *)0x0;
  local_60._16_8_ = (sp_counted_base *)0x0;
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_013d4d60;
  local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_2a0 = "Simple Bloom filter didn\'t match input signature";
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_3e8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,_cVar8,
             (size_t)&local_3f0,0x7f);
  boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
  CBloomFilter::CBloomFilter((CBloomFilter *)local_2b8,10,1e-06,0,'\x01');
  uVar2 = local_308._16_8_;
  uVar1 = local_308._0_8_;
  local_308._0_8_ = local_2b8._0_8_;
  local_308._8_8_ = local_2b8._8_8_;
  local_308._16_8_ = local_2b8._16_8_;
  local_2b8._0_8_ = (_func_int **)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = (pointer)0x0;
  if ((_func_int **)uVar1 != (_func_int **)0x0) {
    operator_delete((void *)uVar1,uVar2 - uVar1);
  }
  local_2e8 = local_298._0_1_;
  local_308._24_8_ = pcStack_2a0;
  if ((_func_int **)local_2b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
  }
  memcpy(local_2b8,util::hex_literals::detail::Hex<131ul>{std::array<std::byte_65ul>,0x41);
  vKey_02.m_size = 0x41;
  vKey_02.m_data = local_2b8;
  CBloomFilter::insert((CBloomFilter *)local_308,vKey_02);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x83;
  file_02.m_begin = (iterator)&local_400;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_410,
             msg_02);
  local_60[0] = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_e0);
  local_60._8_8_ = (element_type *)0x0;
  local_60._16_8_ = (sp_counted_base *)0x0;
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_013d4da0;
  local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_2a0 = "Simple Bloom filter didn\'t match input pub key";
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_418 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,_cVar8,
             (size_t)&local_420,0x83);
  boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
  CBloomFilter::CBloomFilter((CBloomFilter *)local_2b8,10,1e-06,0,'\x01');
  uVar2 = local_308._16_8_;
  uVar1 = local_308._0_8_;
  local_308._0_8_ = local_2b8._0_8_;
  local_308._8_8_ = local_2b8._8_8_;
  local_308._16_8_ = local_2b8._16_8_;
  local_2b8._0_8_ = (_func_int **)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = (pointer)0x0;
  if ((_func_int **)uVar1 != (_func_int **)0x0) {
    operator_delete((void *)uVar1,uVar2 - uVar1);
  }
  local_2e8 = local_298._0_1_;
  local_308._24_8_ = pcStack_2a0;
  if ((_func_int **)local_2b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
  }
  local_2b8._0_8_ = 0xc7538050dd3f9404;
  local_2b8._8_8_ = 0x75e2c63b6d100050;
  local_2b8._16_4_ = 0x19ffbc4d;
  vKey_03.m_size = 0x14;
  vKey_03.m_data = local_2b8;
  CBloomFilter::insert((CBloomFilter *)local_308,vKey_03);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x87;
  file_03.m_begin = (iterator)&local_430;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_440,
             msg_03);
  local_60[0] = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_e0);
  local_60._8_8_ = (element_type *)0x0;
  local_60._16_8_ = (sp_counted_base *)0x0;
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_013d4de0;
  local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_2a0 = "Simple Bloom filter didn\'t match output address";
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_448 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,_cVar8,
             (size_t)&local_450,0x87);
  boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x88;
  file_04.m_begin = (iterator)&local_460;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_470,
             msg_04);
  local_60[0] = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_268);
  local_60._8_8_ = (element_type *)0x0;
  local_60._16_8_ = (sp_counted_base *)0x0;
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_013d4e20;
  local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_2a0 = "Simple Bloom filter didn\'t add output";
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_478 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,_cVar8,
             (size_t)&local_480,0x88);
  boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
  CBloomFilter::CBloomFilter((CBloomFilter *)local_2b8,10,1e-06,0,'\x01');
  uVar2 = local_308._16_8_;
  uVar1 = local_308._0_8_;
  local_308._0_8_ = local_2b8._0_8_;
  local_308._8_8_ = local_2b8._8_8_;
  local_308._16_8_ = local_2b8._16_8_;
  local_2b8._0_8_ = (_func_int **)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = (pointer)0x0;
  if ((_func_int **)uVar1 != (_func_int **)0x0) {
    operator_delete((void *)uVar1,uVar2 - uVar1);
  }
  local_2e8 = local_298._0_1_;
  local_308._24_8_ = pcStack_2a0;
  if ((_func_int **)local_2b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
  }
  local_2b8._0_8_ = 0x765465296d4366a2;
  local_2b8._8_8_ = 0xb9a732905de1b908;
  local_2b8._16_4_ = 0x31a44fd6;
  vKey_04.m_size = 0x14;
  vKey_04.m_data = local_2b8;
  CBloomFilter::insert((CBloomFilter *)local_308,vKey_04);
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x8c;
  file_05.m_begin = (iterator)&local_490;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_4a0,
             msg_05);
  local_60[0] = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_e0);
  local_60._8_8_ = (element_type *)0x0;
  local_60._16_8_ = (sp_counted_base *)0x0;
  local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
  local_2b8._0_8_ = &PTR__lazy_ostream_013d4de0;
  local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_2a0 = "Simple Bloom filter didn\'t match output address";
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_4a8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,_cVar8,
             (size_t)&local_4b0,0x8c);
  boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
  pcVar5 = (char *)0x1;
  CBloomFilter::CBloomFilter((CBloomFilter *)local_2b8,10,1e-06,0,'\x01');
  uVar2 = local_308._16_8_;
  uVar1 = local_308._0_8_;
  local_308._0_8_ = local_2b8._0_8_;
  local_308._8_8_ = local_2b8._8_8_;
  local_308._16_8_ = local_2b8._16_8_;
  local_2b8._0_8_ = (_func_int **)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = (pointer)0x0;
  if ((_func_int **)uVar1 != (_func_int **)0x0) {
    operator_delete((void *)uVar1,uVar2 - uVar1);
  }
  local_2e8 = local_298._0_1_;
  local_308._24_8_ = pcStack_2a0;
  if ((_func_int **)local_2b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
  }
  str._M_str = pcVar5;
  str._M_len = (size_t)"90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b";
  detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)0x40,str);
  if (local_40 == true) {
    local_2b8._0_8_ = CONCAT71(local_60._1_7_,local_60[0]);
    local_2b8._16_8_ = local_60._16_8_;
    pcStack_2a0 = (char *)local_60._24_8_;
    local_2b8._8_8_ = local_60._8_8_;
    local_298 = 0;
    CBloomFilter::insert((CBloomFilter *)local_308,(COutPoint *)local_2b8);
    local_4c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
    local_4b8 = "";
    local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x90;
    file_06.m_begin = (iterator)&local_4c0;
    msg_06.m_end = pvVar7;
    msg_06.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4d0,
               msg_06);
    local_60[0] = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_e0);
    local_60._8_8_ = (element_type *)0x0;
    local_60._16_8_ = (sp_counted_base *)0x0;
    local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
    local_2b8._0_8_ = &PTR__lazy_ostream_013d4e60;
    local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    pcStack_2a0 = "Simple Bloom filter didn\'t match COutPoint";
    local_4e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
    local_4d8 = "";
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,_cVar8,
               (size_t)&local_4e0,0x90);
    boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
    pcVar5 = (char *)0x1;
    CBloomFilter::CBloomFilter((CBloomFilter *)local_2b8,10,1e-06,0,'\x01');
    uVar2 = local_308._16_8_;
    uVar1 = local_308._0_8_;
    local_308._0_8_ = local_2b8._0_8_;
    local_308._8_8_ = local_2b8._8_8_;
    local_308._16_8_ = local_2b8._16_8_;
    local_2b8._0_8_ = (_func_int **)0x0;
    local_2b8._8_8_ = (pointer)0x0;
    local_2b8._16_8_ = (pointer)0x0;
    if ((_func_int **)uVar1 != (_func_int **)0x0) {
      operator_delete((void *)uVar1,uVar2 - uVar1);
    }
    local_2e8 = local_298._0_1_;
    local_308._24_8_ = pcStack_2a0;
    if ((_func_int **)local_2b8._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
    }
    str_00._M_str = pcVar5;
    str_00._M_len = (size_t)"90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b";
    detail::FromHex<uint256>((optional<uint256> *)local_2b8,(detail *)0x40,str_00);
    if (local_298._0_1_ == true) {
      local_2c8 = (pointer)local_2b8._16_8_;
      pcStack_2c0 = pcStack_2a0;
      local_2d8 = (_func_int **)local_2b8._0_8_;
      puStack_2d0 = (pointer)local_2b8._8_8_;
      puVar4 = (uchar *)operator_new(0x24);
      puVar4[0x20] = '\0';
      puVar4[0x21] = '\0';
      puVar4[0x22] = '\0';
      puVar4[0x23] = '\0';
      *(_func_int ***)puVar4 = local_2d8;
      *(pointer *)(puVar4 + 8) = puStack_2d0;
      *(pointer *)(puVar4 + 0x10) = local_2c8;
      *(char **)(puVar4 + 0x18) = pcStack_2c0;
      puVar4[0x20] = '\0';
      puVar4[0x21] = '\0';
      puVar4[0x22] = '\0';
      puVar4[0x23] = '\0';
      vKey_05.m_size = 0x24;
      vKey_05.m_data = puVar4;
      CBloomFilter::insert((CBloomFilter *)local_308,vKey_05);
      operator_delete(puVar4,0x24);
      local_4f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_4e8 = "";
      local_500 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_07.m_end = (iterator)0x9a;
      file_07.m_begin = (iterator)&local_4f0;
      msg_07.m_end = pvVar7;
      msg_07.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_500,
                 msg_07);
      local_60[0] = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_e0);
      local_60._8_8_ = (element_type *)0x0;
      local_60._16_8_ = (sp_counted_base *)0x0;
      local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
      local_2b8._0_8_ = &PTR__lazy_ostream_013d4ea0;
      local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
      pcStack_2a0 = "Simple Bloom filter didn\'t match manually serialized COutPoint";
      local_510 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_508 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x1;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,_cVar8,
                 (size_t)&local_510,0x9a);
      boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
      CBloomFilter::CBloomFilter((CBloomFilter *)local_2b8,10,1e-06,0,'\x01');
      uVar2 = local_308._16_8_;
      uVar1 = local_308._0_8_;
      local_308._0_8_ = local_2b8._0_8_;
      local_308._8_8_ = local_2b8._8_8_;
      local_308._16_8_ = local_2b8._16_8_;
      local_2b8._0_8_ = (_func_int **)0x0;
      local_2b8._8_8_ = (pointer)0x0;
      local_2b8._16_8_ = (pointer)0x0;
      if ((_func_int **)uVar1 != (_func_int **)0x0) {
        operator_delete((void *)uVar1,uVar2 - uVar1);
      }
      local_2e8 = local_298._0_1_;
      local_308._24_8_ = pcStack_2a0;
      if ((_func_int **)local_2b8._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
      }
      local_2b8._0_8_ = (_func_int **)0xb915ff832b110436;
      local_2b8._8_8_ = (pointer)0x98e07ba658647343;
      local_2b8._16_8_ = (pointer)0x62ef849763d4f45b;
      pcStack_2a0 = (char *)0x9e784f32f;
      vKey_06.m_size = 0x20;
      vKey_06.m_data = local_2b8;
      CBloomFilter::insert((CBloomFilter *)local_308,vKey_06);
      local_520 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_518 = "";
      local_530 = &boost::unit_test::basic_cstring<char_const>::null;
      local_528 = &boost::unit_test::basic_cstring<char_const>::null;
      file_08.m_end = (iterator)0x9e;
      file_08.m_begin = (iterator)&local_520;
      msg_08.m_end = pvVar7;
      msg_08.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_530,
                 msg_08);
      bVar3 = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_e0);
      local_60[0] = !bVar3;
      local_60._8_8_ = (element_type *)0x0;
      local_60._16_8_ = (sp_counted_base *)0x0;
      local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
      local_2b8._0_8_ = &PTR__lazy_ostream_013d4e60;
      local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
      pcStack_2a0 = "Simple Bloom filter matched random tx hash";
      local_540 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_538 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x1;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,_cVar8,
                 (size_t)&local_540,0x9e);
      boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
      CBloomFilter::CBloomFilter((CBloomFilter *)local_2b8,10,1e-06,0,'\x01');
      uVar2 = local_308._16_8_;
      uVar1 = local_308._0_8_;
      local_308._0_8_ = local_2b8._0_8_;
      local_308._8_8_ = local_2b8._8_8_;
      local_308._16_8_ = local_2b8._16_8_;
      local_2b8._0_8_ = (_func_int **)0x0;
      local_2b8._8_8_ = (pointer)0x0;
      local_2b8._16_8_ = (pointer)0x0;
      if ((_func_int **)uVar1 != (_func_int **)0x0) {
        operator_delete((void *)uVar1,uVar2 - uVar1);
      }
      local_2e8 = local_298._0_1_;
      local_308._24_8_ = pcStack_2a0;
      if ((_func_int **)local_2b8._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
      }
      local_2b8._0_8_ = 0x765465296d000000;
      local_2b8._8_8_ = 0xb9a732905de1b908;
      local_2b8._16_4_ = 0x31a44fd6;
      vKey_07.m_size = 0x14;
      vKey_07.m_data = local_2b8;
      CBloomFilter::insert((CBloomFilter *)local_308,vKey_07);
      local_550 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_548 = "";
      local_560 = &boost::unit_test::basic_cstring<char_const>::null;
      local_558 = &boost::unit_test::basic_cstring<char_const>::null;
      file_09.m_end = (iterator)0xa2;
      file_09.m_begin = (iterator)&local_550;
      msg_09.m_end = pvVar7;
      msg_09.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_560,
                 msg_09);
      bVar3 = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_e0);
      local_60[0] = !bVar3;
      local_60._8_8_ = (element_type *)0x0;
      local_60._16_8_ = (sp_counted_base *)0x0;
      local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
      local_2b8._0_8_ = &PTR__lazy_ostream_013d4e60;
      local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
      pcStack_2a0 = "Simple Bloom filter matched random address";
      local_570 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_568 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x1;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,_cVar8,
                 (size_t)&local_570,0xa2);
      boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
      pcVar5 = (char *)0x1;
      CBloomFilter::CBloomFilter((CBloomFilter *)local_2b8,10,1e-06,0,'\x01');
      uVar2 = local_308._16_8_;
      uVar1 = local_308._0_8_;
      local_308._0_8_ = local_2b8._0_8_;
      local_308._8_8_ = local_2b8._8_8_;
      local_308._16_8_ = local_2b8._16_8_;
      local_2b8._0_8_ = (_func_int **)0x0;
      local_2b8._8_8_ = (pointer)0x0;
      local_2b8._16_8_ = (pointer)0x0;
      if ((_func_int **)uVar1 != (_func_int **)0x0) {
        operator_delete((void *)uVar1,uVar2 - uVar1);
      }
      local_2e8 = local_298._0_1_;
      local_308._24_8_ = pcStack_2a0;
      if ((_func_int **)local_2b8._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
      }
      str_01._M_str = pcVar5;
      str_01._M_len = (size_t)"90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b";
      detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)0x40,str_01);
      if (local_40 == true) {
        local_2b8._0_8_ = CONCAT71(local_60._1_7_,local_60[0]);
        local_2b8._16_8_ = local_60._16_8_;
        pcStack_2a0 = (char *)local_60._24_8_;
        local_2b8._8_8_ = local_60._8_8_;
        local_298 = 1;
        CBloomFilter::insert((CBloomFilter *)local_308,(COutPoint *)local_2b8);
        local_580 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp"
        ;
        local_578 = "";
        local_590 = &boost::unit_test::basic_cstring<char_const>::null;
        local_588 = &boost::unit_test::basic_cstring<char_const>::null;
        file_10.m_end = (iterator)0xa6;
        file_10.m_begin = (iterator)&local_580;
        msg_10.m_end = pvVar7;
        msg_10.m_begin = pvVar6;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_590
                   ,msg_10);
        bVar3 = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_e0);
        local_60[0] = !bVar3;
        local_60._8_8_ = (element_type *)0x0;
        local_60._16_8_ = (sp_counted_base *)0x0;
        local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
        local_2b8._0_8_ = &PTR__lazy_ostream_013d4ee0;
        local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
        pcStack_2a0 = "Simple Bloom filter matched COutPoint for an output we didn\'t care about";
        local_5a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp"
        ;
        local_598 = "";
        pvVar6 = (iterator)0x1;
        pvVar7 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,_cVar8,
                   (size_t)&local_5a0,0xa6);
        boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
        pcVar5 = (char *)0x1;
        CBloomFilter::CBloomFilter((CBloomFilter *)local_2b8,10,1e-06,0,'\x01');
        uVar2 = local_308._16_8_;
        uVar1 = local_308._0_8_;
        local_308._0_8_ = local_2b8._0_8_;
        local_308._8_8_ = local_2b8._8_8_;
        local_308._16_8_ = local_2b8._16_8_;
        local_2b8._0_8_ = (_func_int **)0x0;
        local_2b8._8_8_ = (pointer)0x0;
        local_2b8._16_8_ = (pointer)0x0;
        if ((_func_int **)uVar1 != (_func_int **)0x0) {
          operator_delete((void *)uVar1,uVar2 - uVar1);
        }
        local_2e8 = local_298._0_1_;
        local_308._24_8_ = pcStack_2a0;
        if ((_func_int **)local_2b8._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
        }
        str_02._M_str = pcVar5;
        str_02._M_len = (size_t)"000000d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b";
        detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)0x40,str_02);
        if (local_40 == true) {
          local_2b8._0_8_ = CONCAT71(local_60._1_7_,local_60[0]);
          local_2b8._16_8_ = local_60._16_8_;
          pcStack_2a0 = (char *)local_60._24_8_;
          local_2b8._8_8_ = local_60._8_8_;
          local_298 = 0;
          CBloomFilter::insert((CBloomFilter *)local_308,(COutPoint *)local_2b8);
          local_5b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp"
          ;
          local_5a8 = "";
          local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_11.m_end = (iterator)0xaa;
          file_11.m_begin = (iterator)&local_5b0;
          msg_11.m_end = pvVar7;
          msg_11.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                     (size_t)&local_5c0,msg_11);
          bVar3 = CBloomFilter::IsRelevantAndUpdate((CBloomFilter *)local_308,&local_e0);
          local_60[0] = !bVar3;
          local_60._8_8_ = (element_type *)0x0;
          local_60._16_8_ = (sp_counted_base *)0x0;
          local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
          local_2b8._0_8_ = &PTR__lazy_ostream_013d4ee0;
          local_2b8._16_8_ = boost::unit_test::lazy_ostream::inst;
          pcStack_2a0 = "Simple Bloom filter matched COutPoint for an output we didn\'t care about";
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_60,(lazy_ostream *)local_2b8,1,1,WARN,0xe950dc,
                     (size_t)&stack0xfffffffffffffa30,0xaa);
          boost::detail::shared_count::~shared_count((shared_count *)(local_60 + 0x10));
          if ((_func_int **)local_308._0_8_ != (_func_int **)0x0) {
            operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_268.vout);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_268.vin);
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_360);
          if (local_340 != (byte *)0x0) {
            operator_delete(local_340,local_330 - (long)local_340);
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_e0.vout);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_e0.vin);
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_328);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            return;
          }
        }
        else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    std::__throw_bad_optional_access();
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bloom_match)
{
    // Random real transaction (b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b)
    DataStream stream{
        "01000000010b26e9b7735eb6aabdf358bab62f9816a21ba9ebdb719d5299e88607d722c190000000008b4830450220070aca44506c5cef3a16ed519d7c3c39f8aab192c4e1c90d065f37b8a4af6141022100a8e160b856c2d43d27d8fba71e5aef6405b8643ac4cb7cb3c462aced7f14711a0141046d11fee51b0e60666d5049a9101a72741df480b96ee26488a4d3466b95c9a40ac5eeef87e10a5cd336c19a84565f80fa6c547957b7700ff4dfbdefe76036c339ffffffff021bff3d11000000001976a91404943fdd508053c75000106d3bc6e2754dbcff1988ac2f15de00000000001976a914a266436d2965547608b9e15d9032a7b9d64fa43188ac00000000"_hex,
    };
    CTransaction tx(deserialize, TX_WITH_WITNESS, stream);

    // and one which spends it (e2769b09e784f32f62ef849763d4f45b98e07ba658647343b915ff832b110436)
    unsigned char ch[] = {0x01, 0x00, 0x00, 0x00, 0x01, 0x6b, 0xff, 0x7f, 0xcd, 0x4f, 0x85, 0x65, 0xef, 0x40, 0x6d, 0xd5, 0xd6, 0x3d, 0x4f, 0xf9, 0x4f, 0x31, 0x8f, 0xe8, 0x20, 0x27, 0xfd, 0x4d, 0xc4, 0x51, 0xb0, 0x44, 0x74, 0x01, 0x9f, 0x74, 0xb4, 0x00, 0x00, 0x00, 0x00, 0x8c, 0x49, 0x30, 0x46, 0x02, 0x21, 0x00, 0xda, 0x0d, 0xc6, 0xae, 0xce, 0xfe, 0x1e, 0x06, 0xef, 0xdf, 0x05, 0x77, 0x37, 0x57, 0xde, 0xb1, 0x68, 0x82, 0x09, 0x30, 0xe3, 0xb0, 0xd0, 0x3f, 0x46, 0xf5, 0xfc, 0xf1, 0x50, 0xbf, 0x99, 0x0c, 0x02, 0x21, 0x00, 0xd2, 0x5b, 0x5c, 0x87, 0x04, 0x00, 0x76, 0xe4, 0xf2, 0x53, 0xf8, 0x26, 0x2e, 0x76, 0x3e, 0x2d, 0xd5, 0x1e, 0x7f, 0xf0, 0xbe, 0x15, 0x77, 0x27, 0xc4, 0xbc, 0x42, 0x80, 0x7f, 0x17, 0xbd, 0x39, 0x01, 0x41, 0x04, 0xe6, 0xc2, 0x6e, 0xf6, 0x7d, 0xc6, 0x10, 0xd2, 0xcd, 0x19, 0x24, 0x84, 0x78, 0x9a, 0x6c, 0xf9, 0xae, 0xa9, 0x93, 0x0b, 0x94, 0x4b, 0x7e, 0x2d, 0xb5, 0x34, 0x2b, 0x9d, 0x9e, 0x5b, 0x9f, 0xf7, 0x9a, 0xff, 0x9a, 0x2e, 0xe1, 0x97, 0x8d, 0xd7, 0xfd, 0x01, 0xdf, 0xc5, 0x22, 0xee, 0x02, 0x28, 0x3d, 0x3b, 0x06, 0xa9, 0xd0, 0x3a, 0xcf, 0x80, 0x96, 0x96, 0x8d, 0x7d, 0xbb, 0x0f, 0x91, 0x78, 0xff, 0xff, 0xff, 0xff, 0x02, 0x8b, 0xa7, 0x94, 0x0e, 0x00, 0x00, 0x00, 0x00, 0x19, 0x76, 0xa9, 0x14, 0xba, 0xde, 0xec, 0xfd, 0xef, 0x05, 0x07, 0x24, 0x7f, 0xc8, 0xf7, 0x42, 0x41, 0xd7, 0x3b, 0xc0, 0x39, 0x97, 0x2d, 0x7b, 0x88, 0xac, 0x40, 0x94, 0xa8, 0x02, 0x00, 0x00, 0x00, 0x00, 0x19, 0x76, 0xa9, 0x14, 0xc1, 0x09, 0x32, 0x48, 0x3f, 0xec, 0x93, 0xed, 0x51, 0xf5, 0xfe, 0x95, 0xe7, 0x25, 0x59, 0xf2, 0xcc, 0x70, 0x43, 0xf9, 0x88, 0xac, 0x00, 0x00, 0x00, 0x00, 0x00};
    std::vector<unsigned char> vch(ch, ch + sizeof(ch) -1);
    DataStream spendStream{vch};
    CTransaction spendingTx(deserialize, TX_WITH_WITNESS, spendStream);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(uint256{"b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b"});
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match tx hash");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    // byte-reversed tx hash
    filter.insert("6bff7fcd4f8565ef406dd5d63d4ff94f318fe82027fd4dc451b04474019f74b4"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match manually serialized tx hash");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("30450220070aca44506c5cef3a16ed519d7c3c39f8aab192c4e1c90d065f37b8a4af6141022100a8e160b856c2d43d27d8fba71e5aef6405b8643ac4cb7cb3c462aced7f14711a01"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match input signature");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("046d11fee51b0e60666d5049a9101a72741df480b96ee26488a4d3466b95c9a40ac5eeef87e10a5cd336c19a84565f80fa6c547957b7700ff4dfbdefe76036c339"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match input pub key");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("04943fdd508053c75000106d3bc6e2754dbcff19"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match output address");
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(spendingTx), "Simple Bloom filter didn't add output");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("a266436d2965547608b9e15d9032a7b9d64fa431"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match output address");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(COutPoint(Txid::FromHex("90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b").value(), 0));
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match COutPoint");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    COutPoint prevOutPoint(Txid::FromHex("90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b").value(), 0);
    {
        std::vector<unsigned char> data(32 + sizeof(unsigned int));
        memcpy(data.data(), prevOutPoint.hash.begin(), 32);
        memcpy(data.data()+32, &prevOutPoint.n, sizeof(unsigned int));
        filter.insert(data);
    }
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match manually serialized COutPoint");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(uint256{"00000009e784f32f62ef849763d4f45b98e07ba658647343b915ff832b110436"});
    BOOST_CHECK_MESSAGE(!filter.IsRelevantAndUpdate(tx), "Simple Bloom filter matched random tx hash");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("0000006d2965547608b9e15d9032a7b9d64fa431"_hex_u8);
    BOOST_CHECK_MESSAGE(!filter.IsRelevantAndUpdate(tx), "Simple Bloom filter matched random address");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(COutPoint(Txid::FromHex("90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b").value(), 1));
    BOOST_CHECK_MESSAGE(!filter.IsRelevantAndUpdate(tx), "Simple Bloom filter matched COutPoint for an output we didn't care about");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(COutPoint(Txid::FromHex("000000d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b").value(), 0));
    BOOST_CHECK_MESSAGE(!filter.IsRelevantAndUpdate(tx), "Simple Bloom filter matched COutPoint for an output we didn't care about");
}